

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.c
# Opt level: O3

double LambertW(double z)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double in_XMM5_Qa;
  
  if (z + 0.36787944117144233 < -2.220446049250313e-15) {
    LambertW_cold_1();
    if (__x <= 2.0) {
      if (__x <= 1.0) {
        if (__x <= 0.5) {
          if (0.0 <= __x) {
            dVar5 = __x * 4.0 + -1.0;
            lVar1 = 0x25;
            dVar9 = 0.0;
            dVar4 = 0.0;
            do {
              dVar6 = dVar9;
              dVar7 = ((dVar5 + dVar5) * dVar4 - dVar6) + spencs[lVar1];
              bVar3 = lVar1 != 0;
              lVar1 = lVar1 + -1;
              dVar9 = dVar4;
              dVar4 = dVar7;
            } while (bVar3);
            in_XMM5_Qa = ((dVar7 - dVar6) * 0.5 + 1.0) * __x;
          }
          else {
            dVar9 = 1.0 - __x;
            dVar4 = log(dVar9);
            if (-1.0 < __x) {
              dVar6 = (__x * 4.0) / (__x + -1.0) + -1.0;
              lVar1 = 0x25;
              dVar9 = 0.0;
              dVar5 = 0.0;
              do {
                dVar7 = dVar5;
                dVar5 = dVar9;
                dVar9 = ((dVar6 + dVar6) * dVar5 - dVar7) + spencs[lVar1];
                bVar3 = lVar1 != 0;
                lVar1 = lVar1 + -1;
              } while (bVar3);
              in_XMM5_Qa = dVar4 * -0.5 * dVar4 -
                           (((dVar9 - dVar7) * 0.5 + 1.0) * __x) / (__x + -1.0);
            }
            else {
              dVar5 = log(-__x);
              in_XMM5_Qa = dVar4 * -0.5 * ((dVar5 + dVar5) - dVar4) + -1.6449340668482264;
              if (-9007199254740992.0 < __x) {
                dVar6 = 4.0 / dVar9 + -1.0;
                lVar1 = 0x25;
                dVar4 = 0.0;
                dVar5 = 0.0;
                do {
                  dVar7 = dVar5;
                  dVar5 = dVar4;
                  dVar4 = ((dVar6 + dVar6) * dVar5 - dVar7) + spencs[lVar1];
                  bVar3 = lVar1 != 0;
                  lVar1 = lVar1 + -1;
                } while (bVar3);
                in_XMM5_Qa = in_XMM5_Qa + ((dVar4 - dVar7) * 0.5 + 1.0) / dVar9;
              }
            }
          }
        }
        else if ((__x != 1.0) || (NAN(__x))) {
          dVar5 = log(__x);
          dVar6 = 1.0 - __x;
          dVar7 = log(dVar6);
          dVar8 = dVar6 * 4.0 + -1.0;
          lVar1 = 0x25;
          dVar9 = 0.0;
          dVar4 = 0.0;
          do {
            dVar10 = dVar4;
            dVar4 = dVar9;
            dVar9 = ((dVar8 + dVar8) * dVar4 - dVar10) + spencs[lVar1];
            bVar3 = lVar1 != 0;
            lVar1 = lVar1 + -1;
          } while (bVar3);
          in_XMM5_Qa = (-dVar5 * dVar7 + 1.6449340668482264) -
                       dVar6 * ((dVar9 - dVar10) * 0.5 + 1.0);
        }
      }
      else {
        dVar5 = __x + -1.0;
        dVar6 = log(__x);
        dVar7 = log((dVar5 * dVar5) / __x);
        dVar8 = (dVar5 * 4.0) / __x + -1.0;
        lVar1 = 0x25;
        dVar9 = 0.0;
        dVar4 = 0.0;
        do {
          dVar10 = dVar4;
          dVar4 = dVar9;
          dVar9 = ((dVar8 + dVar8) * dVar4 - dVar10) + spencs[lVar1];
          bVar3 = lVar1 != 0;
          lVar1 = lVar1 + -1;
        } while (bVar3);
        in_XMM5_Qa = (dVar5 * ((dVar9 - dVar10) * 0.5 + 1.0)) / __x +
                     dVar6 * -0.5 * dVar7 + 1.6449340668482264;
      }
    }
    else {
      dVar9 = log(__x);
      in_XMM5_Qa = dVar9 * -0.5 * dVar9 + 3.289868133696453;
      if (__x < 9007199254740992.0) {
        dVar5 = 4.0 / __x + -1.0;
        lVar1 = 0x25;
        dVar9 = 0.0;
        dVar4 = 0.0;
        do {
          dVar6 = dVar4;
          dVar4 = dVar9;
          dVar9 = ((dVar5 + dVar5) * dVar4 - dVar6) + spencs[lVar1];
          bVar3 = lVar1 != 0;
          lVar1 = lVar1 + -1;
        } while (bVar3);
        in_XMM5_Qa = in_XMM5_Qa - ((dVar9 - dVar6) * 0.5 + 1.0) / __x;
      }
    }
    return in_XMM5_Qa;
  }
  if (-0.36787944117144233 <= z) {
    dVar9 = cbrt(2.220446049250313e-16);
    if (ABS(z) < dVar9) {
      dVar9 = z * 1.5 * z * z + (z - z * z);
    }
    else {
      if (z <= -0.3140862435046707) {
        dVar9 = z * 5.43656365691809 + 2.0;
        if (dVar9 < 0.0) {
          dVar9 = sqrt(dVar9);
        }
        else {
          dVar9 = SQRT(dVar9);
        }
        dVar9 = dVar9 + -1.0;
      }
      else if (z <= 1.149876485041417) {
        dVar9 = z * 1.5 * z * z + (z - z * z);
      }
      else {
        dVar9 = log(z);
        dVar4 = log(dVar9);
        dVar9 = dVar9 - dVar4;
      }
      iVar2 = 0xf;
      do {
        dVar4 = exp(-dVar9);
        if ((dVar9 != -1.0) || (NAN(dVar9))) {
          dVar4 = dVar4 * -z + dVar9;
          dVar4 = -dVar4 / ((dVar9 + 1.0) - ((dVar9 + 2.0) / (dVar9 + dVar9 + 2.0)) * dVar4);
        }
        else {
          dVar4 = 0.0;
        }
        dVar9 = dVar9 + dVar4;
        if (ABS(dVar4) < (ABS(dVar9) + 1.0) * 2.220446049250313e-14) {
          return dVar9;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      fprintf(_stderr,"lambert_w: iteration limit i=%i reached for z= %.16e\nShould never happen!\n"
              ,z,0xf);
      dVar9 = 0.0;
    }
  }
  else {
    dVar9 = -1.0;
  }
  return dVar9;
}

Assistant:

GPU_FUNCTION double LambertW(double z)
{
  double w;
  int i;

  /* Sanity check - function is only defined for z >= -1/e */
  if(z + 1.0/M_E < -10*DBL_EPSILON) {
#ifndef HAVE_CUDA
    fprintf(stderr,"Error - Lambert function called with argument z = %e.\n",z);
    exit(1);
#endif
  } else if(z < -1.0/M_E)
    /* Value of W(x) at x=-1/e is -1 */
    return -1.0;

  /* If z is small, go with the first terms of the power expansion
     (if z smaller than cube root of epsilon, z^4 will be zero to
     machine precision).
   */
  if(fabs(z) < CBRT(DBL_EPSILON))
    return z - z*z + 1.5*z*z*z;

  /* Initial guess. */
  if(z <= -0.3140862435046707) { /* Point where sqrt and Taylor polynomials match */
    /* Near the branching point: first terms in eqn (4.22) */
    w = sqrt(2.0*M_E*z + 2.0) - 1.0;

  } else if(z <= 1.149876485041417) { /* Point where Taylor and log expansion match */

    /* Taylor series around origin */
    w = z - z*z + 1.5*z*z*z;

  } else {
    /* Asymptotic expansion */
    double lnz = log(z);

    w = lnz - log(lnz);
  }

  /* Find result through iteration */
  for(i=0; i<15; i++){
    double expmw, dw;
    expmw = exp(-w);

    /* Halley's equation, (5.9) in Corless et al */
    if( w != -1.0 )
      dw = - (w - z*expmw) / ( w + 1.0 - (w + 2.0)/(2.0*w + 2.0)*(w - z*expmw) );
    else
      dw = 0.0;

    w += dw;
    if(fabs(dw) < 100*DBL_EPSILON*(1.0 + fabs(w)))
      return w;
  }

#ifndef HAVE_CUDA
  /* This should never happen! */
  fprintf(stderr, "lambert_w: iteration limit i=%i reached for z= %.16e\nShould never happen!\n", i, z);
#endif

  return 0.0;
}